

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleColsUp2_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,int dst_width,int x,int dx)

{
  uint16_t uVar1;
  int iVar2;
  
  if (1 < dst_width) {
    iVar2 = 0;
    do {
      uVar1 = *src_ptr;
      *dst_ptr = uVar1;
      dst_ptr[1] = uVar1;
      src_ptr = src_ptr + 1;
      dst_ptr = dst_ptr + 2;
      iVar2 = iVar2 + 2;
    } while (iVar2 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr = *src_ptr;
  }
  return;
}

Assistant:

void ScaleColsUp2_16_C(uint16_t* dst_ptr,
                       const uint16_t* src_ptr,
                       int dst_width,
                       int x,
                       int dx) {
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst_ptr[1] = dst_ptr[0] = src_ptr[0];
    src_ptr += 1;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    dst_ptr[0] = src_ptr[0];
  }
}